

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MazeHeap.h
# Opt level: O0

void __thiscall CMazeHeap::Push(CMazeHeap *this,CGrid *pGrid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iRChildCost;
  int iLChildCost;
  int iRChildPos;
  int iLChildPos;
  int iParPos_2;
  int iCurCost_1;
  int iParPos_1;
  int iCurPos_1;
  int iParPos;
  int iCurCost;
  int iCurPos;
  CGrid *pGrid_local;
  CMazeHeap *this_local;
  
  if (0x27fff < this->m_iSize) {
    __assert_fail("m_iSize<MAX_QUEUE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/MazeHeap.h"
                  ,0xb4,"void CMazeHeap::Push(CGrid *)");
  }
  if (pGrid->m_iHeapPos < 0) {
    iParPos = this->m_iSize;
    pGrid->m_iHeapPos = iParPos;
    iVar1 = this->m_iSize;
    this->m_iSize = iVar1 + 1;
    m_Queue[iVar1] = pGrid;
    iVar1 = CGrid::GetHeapCost(pGrid);
    if (iParPos == 0) {
      return;
    }
    while( true ) {
      iVar2 = (iParPos + -1) / 2;
      iVar3 = CGrid::GetHeapCost(m_Queue[iVar2]);
      if (iVar3 <= iVar1) break;
      Swab(this,iParPos,iVar2);
      iParPos = iVar2;
    }
  }
  else {
    if (pGrid != m_Queue[pGrid->m_iHeapPos]) {
      __assert_fail("pGrid==m_Queue[pGrid->m_iHeapPos]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/MazeHeap.h"
                    ,0xcb,"void CMazeHeap::Push(CGrid *)");
    }
    iCurCost_1 = pGrid->m_iHeapPos;
    iVar1 = CGrid::GetHeapCost(pGrid);
    if ((iCurCost_1 == 0) ||
       (iVar2 = CGrid::GetHeapCost(m_Queue[(iCurCost_1 + -1) / 2]), iVar2 <= iVar1)) {
      if (this->m_iSize == 0) {
        return;
      }
      while( true ) {
        iVar2 = iCurCost_1 * 2 + 1;
        iVar3 = iCurCost_1 * 2 + 2;
        if ((this->m_iSize <= iVar2) || (this->m_iSize <= iVar3)) break;
        iVar4 = CGrid::GetHeapCost(m_Queue[iVar2]);
        iVar5 = CGrid::GetHeapCost(m_Queue[iVar3]);
        if (iVar4 < iVar5) {
          if (iVar1 <= iVar4) goto LAB_0011fd8c;
          Swab(this,iCurCost_1,iVar2);
          iCurCost_1 = iVar2;
        }
        else {
          if (iVar1 <= iVar5) goto LAB_0011fd8c;
          Swab(this,iCurCost_1,iVar3);
          iCurCost_1 = iVar3;
        }
      }
      if ((iVar2 < this->m_iSize) && (iVar3 = CGrid::GetHeapCost(m_Queue[iVar2]), iVar3 < iVar1)) {
        Swab(this,iCurCost_1,iVar2);
      }
    }
    else {
      while( true ) {
        iVar2 = (iCurCost_1 + -1) / 2;
        iVar3 = CGrid::GetHeapCost(m_Queue[iVar2]);
        if (iVar3 <= iVar1) break;
        Swab(this,iCurCost_1,iVar2);
        iCurCost_1 = iVar2;
      }
    }
  }
LAB_0011fd8c:
  if (pGrid == m_Queue[pGrid->m_iHeapPos]) {
    return;
  }
  __assert_fail("pGrid==m_Queue[pGrid->m_iHeapPos]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/MazeHeap.h"
                ,0x106,"void CMazeHeap::Push(CGrid *)");
}

Assistant:

void Push(CGrid* pGrid)
	{
		assert(m_iSize<MAX_QUEUE);
		if(pGrid->m_iHeapPos<0)
		{
			int	iCurPos			=	m_iSize;
			pGrid->m_iHeapPos	=	iCurPos;

			m_Queue[m_iSize++]	=	pGrid;

			int	iCurCost	=	pGrid->GetHeapCost();

			if(iCurPos==0)	return;

			while(TRUE)
			{
				int	iParPos		=	(iCurPos-1)/2;

				if(iCurCost>=m_Queue[iParPos]->GetHeapCost())	break;			
				Swab(iCurPos,iParPos);
				iCurPos	=	iParPos;
			}
		}
		else
		{
			assert(pGrid==m_Queue[pGrid->m_iHeapPos]);
			int	iCurPos		=	pGrid->m_iHeapPos;
			int	iParPos		=	(iCurPos-1)/2;

			int	iCurCost	=	pGrid->GetHeapCost();

			if(iCurPos&&iCurCost<m_Queue[iParPos]->GetHeapCost())
			{
				while(TRUE)
				{
					int	iParPos		=	(iCurPos-1)/2;

					if(iCurCost>=m_Queue[iParPos]->GetHeapCost())	break;
					Swab(iCurPos,iParPos);
					iCurPos	=	iParPos;
				}
			}
			else
			{
				if(m_iSize==0)	return;

				while (TRUE)
				{
					int	iLChildPos	=	iCurPos+iCurPos+1;
					int	iRChildPos	=	iLChildPos+1;

					// both are valid children [2/19/2007 thyeros]
					if(iLChildPos<m_iSize&&iRChildPos<m_iSize)
					{
						int	iLChildCost	=	m_Queue[iLChildPos]->GetHeapCost();
						int	iRChildCost	=	m_Queue[iRChildPos]->GetHeapCost();

						if(iLChildCost<iRChildCost)
						{
							if(iCurCost<=iLChildCost)	break;
							Swab(iCurPos,iLChildPos);
							iCurPos	=	iLChildPos;
						}
						else
						{
							if(iCurCost<=iRChildCost)	break;
							Swab(iCurPos,iRChildPos);
							iCurPos	=	iRChildPos;
						}
					}
					else if(iLChildPos<m_iSize)
					{
						if(iCurCost<=m_Queue[iLChildPos]->GetHeapCost())	break;
						Swab(iCurPos,iLChildPos);
						break;
					}
					else 
					{
						break;
					}
				}
			}
		}

		assert(pGrid==m_Queue[pGrid->m_iHeapPos]);
	}